

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_piz.c
# Opt level: O0

void wdec16(uint16_t l,uint16_t h,uint16_t *a,uint16_t *b)

{
  uint16_t uVar1;
  int aa;
  int bb;
  int d;
  int m;
  uint16_t *b_local;
  uint16_t *a_local;
  uint16_t h_local;
  uint16_t l_local;
  
  uVar1 = l - (short)((int)(uint)h >> 1);
  *b = uVar1;
  *a = h + uVar1 + 0x8000;
  return;
}

Assistant:

static inline void
wdec16 (uint16_t l, uint16_t h, uint16_t* a, uint16_t* b)
{
    int m  = (int) l;
    int d  = (int) h;
    int bb = (m - (d >> 1)) & MOD_MASK;
    int aa = (d + bb - A_OFFSET) & MOD_MASK;
    *b     = (uint16_t) bb;
    *a     = (uint16_t) aa;
}